

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSendSession.cpp
# Opt level: O1

void __thiscall FileSendSession::on_output(FileSendSession *this,Poll *p)

{
  SendBuffer *this_00;
  uint uVar1;
  pointer pcVar2;
  int __fd;
  char *__buf;
  ssize_t sVar3;
  ostream *poVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  path local_88;
  path local_68;
  path local_48;
  
  this_00 = &this->buff;
  if ((this->buff).read == (this->buff).full) {
    std::istream::read((char *)&this->stream,0x14c560);
    SendBuffer::load_bytes
              (this_00,FILE_SEND_BUF,
               *(int *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x8)
    ;
    uVar1 = *(uint *)(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20
                     + *(long *)(*(long *)&(this->stream).
                                           super_basic_fstream<char,_std::char_traits<char>_> +
                                -0x18));
    if ((char)((uVar1 & 2) >> 1) != '\0' || (uVar1 & 5) == 0) goto LAB_00138e97;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(this->super_Subscriber).name._M_dataplus._M_p,
                        (this->super_Subscriber).name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,": Error in reading from file, disconnecting\n",0x2c);
    if ((this->error).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_00139051;
    paVar6 = &local_48.m_pathname.field_2;
    pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
    local_48.m_pathname._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
    if ((this->error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->error)._M_invoker)((_Any_data *)&this->error,&local_48);
    _Var5._M_p = local_48.m_pathname._M_dataplus._M_p;
  }
  else {
LAB_00138e97:
    __fd = Subscriber::get_fd(&this->super_Subscriber);
    __buf = SendBuffer::read_pos(this_00);
    sVar3 = write(__fd,__buf,(long)(this->buff).full - (long)(this->buff).read);
    if ((int)sVar3 < 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(this->super_Subscriber).name._M_dataplus._M_p,
                          (this->super_Subscriber).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,": Error in writing to socket, disconnecting\n",0x2c);
      if ((this->error).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_00139051;
      paVar6 = &local_68.m_pathname.field_2;
      pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
      local_68.m_pathname._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
      if ((this->error).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->error)._M_invoker)((_Any_data *)&this->error,&local_68);
      _Var5._M_p = local_68.m_pathname._M_dataplus._M_p;
    }
    else {
      SendBuffer::on_read_bytes(this_00,(int)sVar3);
      if ((this->buff).read != (this->buff).full) {
        return;
      }
      if (((&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20)
           [*(long *)(*(long *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> +
                     -0x18)] & 2) == 0) {
        return;
      }
      if ((this->success).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_00139051;
      paVar6 = &local_88.m_pathname.field_2;
      pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
      local_88.m_pathname._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
      if ((this->success).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->success)._M_invoker)((_Any_data *)&this->success,&local_88);
      _Var5._M_p = local_88.m_pathname._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar6) {
    operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
  }
LAB_00139051:
  Poll::unsubscribe(p,&this->super_Subscriber);
  return;
}

Assistant:

void FileSendSession::on_output(Poll &p) {
  if (buff.is_all_read()) {
    stream.read(FILE_SEND_BUF, FILE_SEND_BUF_SIZE);
    buff.load_bytes(FILE_SEND_BUF, stream.gcount());
    if (!stream && !stream.eof()) {
      std::cout << this->name << ": Error in reading from file, disconnecting\n";
      if (this->error)
        this->error(file);
      p.unsubscribe(*this);
      return;
    }
  }
  int n = write(this->get_fd(), buff.read_pos(), buff.remaining_to_read());
  if (n < 0) {
    std::cout << this->name << ": Error in writing to socket, disconnecting\n";
    if (this->error)
      this->error(file);
    p.unsubscribe(*this);
    return;
  }
  buff.on_read_bytes(n);
  if (buff.is_all_read() && stream.eof()) {
    if (this->success)
      this->success(file);
    p.unsubscribe(*this);
  }
}